

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SySetInit(SySet *pSet,SyMemBackend *pAllocator,sxu32 ElemSize)

{
  sxu32 ElemSize_local;
  SyMemBackend *pAllocator_local;
  SySet *pSet_local;
  
  pSet->nSize = 0;
  pSet->nUsed = 0;
  pSet->nCursor = 0;
  pSet->eSize = ElemSize;
  pSet->pAllocator = pAllocator;
  pSet->pBase = (void *)0x0;
  pSet->pUserData = (void *)0x0;
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SySetInit(SySet *pSet, SyMemBackend *pAllocator, sxu32 ElemSize)
{
	pSet->nSize = 0 ;
	pSet->nUsed = 0;
	pSet->nCursor = 0;
	pSet->eSize = ElemSize;
	pSet->pAllocator = pAllocator;
	pSet->pBase =  0;
	pSet->pUserData = 0;
	return SXRET_OK;
}